

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O3

void PrintFinalStats(void *kmem)

{
  uint uVar1;
  long leniwB;
  long lenrwB;
  long nfeD;
  long nje;
  long nfe;
  long nni;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar1 = KINGetNumNonlinSolvIters(kmem,&local_10);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINGetNumNonlinSolvIters",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumFuncEvals(kmem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINGetNumFuncEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumJacEvals(kmem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINGetNumJacEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumLinFuncEvals(kmem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINGetNumLinFuncEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetLinWorkSpace(kmem,&local_30,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINGetLinWorkSpace",
            (ulong)uVar1);
  }
  puts("\nFinal Statistics.. \n");
  printf("nni      = %6ld    nfe     = %6ld \n",local_10,local_18);
  printf("nje      = %6ld    nfeB    = %6ld \n",local_20,local_28);
  putchar(10);
  printf("lenrwB   = %6ld    leniwB  = %6ld \n",local_30,local_38);
  return;
}

Assistant:

static void PrintFinalStats(void* kmem)
{
  long int nni, nfe, nje, nfeD;
  long int lenrwB, leniwB;
  int retval;

  /* Main solver statistics */

  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);
  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  /* Band linear solver statistics */

  retval = KINGetNumJacEvals(kmem, &nje);
  check_retval(&retval, "KINGetNumJacEvals", 1);
  retval = KINGetNumLinFuncEvals(kmem, &nfeD);
  check_retval(&retval, "KINGetNumLinFuncEvals", 1);

  /* Band linear solver workspace size */

  retval = KINGetLinWorkSpace(kmem, &lenrwB, &leniwB);
  check_retval(&retval, "KINGetLinWorkSpace", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n", nni, nfe);
  printf("nje      = %6ld    nfeB    = %6ld \n", nje, nfeD);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n", lenrwB, leniwB);
}